

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

basic_variable<std::allocator<char>_> *
trial::dynamic::convert::
overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_void>
::into(basic_variable<std::allocator<char>_> *__return_storage_ptr__,
      vector<double,_std::allocator<double>_> *array,error_code *param_2)

{
  pointer pdVar1;
  double *entry;
  pointer other;
  
  basic_array<std::allocator<char>_>::make();
  pdVar1 = (array->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (other = (array->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start; other != pdVar1; other = other + 1) {
    detail::overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_double,_void>::append
              (__return_storage_ptr__,other);
  }
  return __return_storage_ptr__;
}

Assistant:

static basic_variable<Allocator> into(const std::vector<T>& array,
                                          std::error_code&)
    {
        auto result = basic_array<Allocator>::make();
        for (const auto& entry : array)
        {
            result += entry;
        }
        return result;
    }